

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O1

void __thiscall
t_perl_generator::generate_serialize_field
          (t_perl_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  t_type *ttype;
  long *plVar4;
  undefined8 *puVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  size_type *psVar8;
  long *plVar9;
  t_struct *tstruct;
  _Alloc_hider _Var10;
  t_base_type *this_00;
  undefined1 auVar11 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 local_50 [32];
  
  ttype = t_type::get_true_type(tfield->type_);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar3 != '\0') {
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&local_f0,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar7,&local_f0,&tfield->name_);
    __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar3 == '\0')) {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if (((char)iVar3 == '\0') &&
         (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar3 == '\0')) {
        pcVar1 = (prefix->_M_dataplus)._M_p;
        pcVar2 = (tfield->name_)._M_dataplus._M_p;
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
        printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",pcVar1,pcVar2,
               *(undefined8 *)CONCAT44(extraout_var,iVar3));
        return;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      pcVar1 = (tfield->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar1,pcVar1 + (tfield->name_)._M_string_length);
      if (prefix->_M_string_length != 0) {
        local_b0[0] = local_a0;
        pcVar1 = (prefix->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,pcVar1,pcVar1 + prefix->_M_string_length);
        std::__cxx11::string::append((char *)local_b0);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_b0,(ulong)(tfield->name_)._M_dataplus._M_p);
        plVar9 = plVar4 + 2;
        if ((long *)*plVar4 == plVar9) {
          local_80 = *plVar9;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar9;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        psVar8 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0.field_2._8_8_ = puVar5[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar8;
          local_d0._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_d0._M_string_length = puVar5[1];
        *puVar5 = psVar8;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0]);
        }
      }
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"$xfer += $output->",0x12);
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
        if ((char)iVar3 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI32($",10);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_f0._M_dataplus._M_p,local_f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
        }
      }
      else {
        this_00 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
        switch(this_00) {
        case (t_base_type *)0x0:
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::operator+(pbVar7,"compiler error: cannot serialize void field in a struct: ",
                         &local_f0);
          __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        case (t_base_type *)0x1:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeString($",0xd);
          break;
        case (t_base_type *)0x2:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeBool($",0xb);
          break;
        case (t_base_type *)0x3:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeByte($",0xb);
          break;
        case (t_base_type *)0x4:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI16($",10);
          break;
        case (t_base_type *)0x5:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI32($",10);
          break;
        case (t_base_type *)0x6:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeI64($",10);
          break;
        case (t_base_type *)0x7:
          std::__ostream_insert<char,std::char_traits<char>>(out,"writeDouble($",0xd);
          break;
        default:
          auVar11 = __cxa_allocate_exception(0x20);
          t_base_type::t_base_name_abi_cxx11_(&local_d0,this_00,auVar11._8_4_);
          std::operator+(auVar11._0_8_,"compiler error: no PERL name for base type ",&local_d0);
          __cxa_throw(auVar11._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      _Var10._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
        return;
      }
      goto LAB_002eb2cc;
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    pcVar1 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_d0);
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_d0,(ulong)(tfield->name_)._M_dataplus._M_p);
    psVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0.field_2._8_8_ = puVar5[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_f0._M_string_length = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_70.field_2._M_allocated_capacity = *psVar8;
      local_70.field_2._8_8_ = plVar4[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar8;
      local_70._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_70._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    generate_serialize_container(this,out,ttype,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_002eb2bd;
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    pcVar1 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_d0);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(tfield->name_)._M_dataplus._M_p);
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0.field_2._8_8_ = plVar4[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
    tstruct = (t_struct *)(plVar4 + 2);
    if ((t_struct *)*plVar4 == tstruct) {
      local_50._16_8_ = (tstruct->super_t_type).super_t_doc._vptr_t_doc;
      local_50._24_8_ = plVar4[3];
      local_50._0_8_ = (t_struct *)(local_50 + 0x10);
    }
    else {
      local_50._16_8_ = (tstruct->super_t_type).super_t_doc._vptr_t_doc;
      local_50._0_8_ = (t_struct *)*plVar4;
    }
    local_50._8_8_ = plVar4[1];
    *plVar4 = (long)tstruct;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    generate_serialize_struct(this,out,tstruct,(string *)local_50);
    if ((t_struct *)local_50._0_8_ != (t_struct *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
LAB_002eb2bd:
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  _Var10._M_p = local_d0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
    return;
  }
LAB_002eb2cc:
  operator_delete(_Var10._M_p);
  return;
}

Assistant:

void t_perl_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + "{" + tfield->get_name() + "}");
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + "{" + tfield->get_name() + "}");
  } else if (type->is_base_type() || type->is_enum()) {

    string name = tfield->get_name();

    // Hack for when prefix is defined (always a hash ref)
    if (!prefix.empty())
      name = prefix + "{" + tfield->get_name() + "}";

    indent(out) << "$xfer += $output->";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        out << "writeString($" << name << ");";
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool($" << name << ");";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte($" << name << ");";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16($" << name << ");";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32($" << name << ");";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64($" << name << ");";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble($" << name << ");";
        break;
      default:
        throw "compiler error: no PERL name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "writeI32($" << name << ");";
    }
    out << endl;

  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}